

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Arg::parse_ulong_radix(char *str,int n,void *dest,int radix)

{
  int *piVar1;
  ulong uVar2;
  unsigned_long r;
  char *end;
  char buf [33];
  int radix_local;
  void *dest_local;
  char *pcStack_18;
  int n_local;
  char *str_local;
  
  if (n == 0) {
    str_local._7_1_ = false;
  }
  else {
    dest_local._4_4_ = n;
    pcStack_18 = str;
    pcStack_18 = TerminateNumber((char *)&end,0x21,str,(int *)((long)&dest_local + 4),false);
    if (*pcStack_18 == '-') {
      str_local._7_1_ = false;
    }
    else {
      piVar1 = __errno_location();
      *piVar1 = 0;
      uVar2 = strtoul(pcStack_18,(char **)&r,radix);
      if ((char *)r == pcStack_18 + dest_local._4_4_) {
        piVar1 = __errno_location();
        if (*piVar1 == 0) {
          if (dest == (void *)0x0) {
            str_local._7_1_ = true;
          }
          else {
            *(ulong *)dest = uVar2;
            str_local._7_1_ = true;
          }
        }
        else {
          str_local._7_1_ = false;
        }
      }
      else {
        str_local._7_1_ = false;
      }
    }
  }
  return str_local._7_1_;
}

Assistant:

bool RE2::Arg::parse_ulong_radix(const char* str,
                                int n,
                                void* dest,
                                int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, false);
  if (str[0] == '-') {
   // strtoul() will silently accept negative numbers and parse
   // them.  This module is more strict and treats them as errors.
   return false;
  }

  char* end;
  errno = 0;
  unsigned long r = strtoul(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<unsigned long*>(dest)) = r;
  return true;
}